

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

void deqp::gles2::Functional::randomPartition
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst,Random *rnd,
               int x,int y,int width,int height)

{
  bool bVar1;
  int iVar2;
  int width_00;
  ulong uVar3;
  float fVar4;
  int local_54;
  Vector<int,_4> local_40;
  
  uVar3 = (ulong)(uint)width;
  local_54 = x;
  do {
    while( true ) {
      fVar4 = deRandom_getFloat(&rnd->m_rnd);
      width_00 = (int)uVar3;
      if ((8 < width_00) && (0.4 < fVar4)) break;
LAB_003626bc:
      if ((height < 9) || (fVar4 <= 0.4)) {
        local_40.m_data[0] = local_54;
        local_40.m_data[1] = y;
        local_40.m_data[2] = width_00;
        local_40.m_data[3] = height;
        std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
        emplace_back<tcu::Vector<int,4>>
                  ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)dst,&local_40);
        return;
      }
      iVar2 = de::Random::getInt(rnd,-((uint)height >> 2),(uint)height >> 2);
      iVar2 = iVar2 + ((uint)height >> 1);
      randomPartition(dst,rnd,local_54,y,width_00,iVar2);
      y = y + iVar2;
      height = height - iVar2;
    }
    bVar1 = de::Random::getBool(rnd);
    if (!bVar1) goto LAB_003626bc;
    iVar2 = (int)(uVar3 >> 2);
    iVar2 = de::Random::getInt(rnd,-iVar2,iVar2);
    iVar2 = iVar2 + (int)(uVar3 >> 1);
    randomPartition(dst,rnd,local_54,y,iVar2,height);
    local_54 = local_54 + iVar2;
    uVar3 = (ulong)(uint)(width_00 - iVar2);
  } while( true );
}

Assistant:

static void randomPartition (vector<IVec4>& dst, de::Random& rnd, int x, int y, int width, int height)
{
	const int minWidth	= 8;
	const int minHeight	= 8;

	bool	partition		= rnd.getFloat() > 0.4f;
	bool	partitionX		= partition && width > minWidth && rnd.getBool();
	bool	partitionY		= partition && height > minHeight && !partitionX;

	if (partitionX)
	{
		int split = width/2 + rnd.getInt(-width/4, +width/4);
		randomPartition(dst, rnd, x, y, split, height);
		randomPartition(dst, rnd, x+split, y, width-split, height);
	}
	else if (partitionY)
	{
		int split = height/2 + rnd.getInt(-height/4, +height/4);
		randomPartition(dst, rnd, x, y, width, split);
		randomPartition(dst, rnd, x, y+split, width, height-split);
	}
	else
		dst.push_back(IVec4(x, y, width, height));
}